

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O3

ByteData * __thiscall cfd::core::Amount::GetByteData(ByteData *__return_storage_ptr__,Amount *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 8);
  *(int64_t *)
   local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = this->amount_;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::ByteData(__return_storage_ptr__,&local_28);
  if ((int64_t *)
      local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (int64_t *)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Amount::GetByteData() const {
  std::vector<uint8_t> bytes(sizeof(amount_));
  memcpy(bytes.data(), &amount_, bytes.size());
#if defined(__BYTE_ORDER) && defined(__BIG_ENDIAN)
#if __BYTE_ORDER == __BIG_ENDIAN
  // big -> little
  std::reverse(bytes.begin(), bytes.end());
#endif  // __BYTE_ORDER == __BIG_ENDIAN
#else
#if defined(__BIG_ENDIAN__)
  std::reverse(bytes.begin(), bytes.end());
#endif  // __BIG_ENDIAN__
#endif
  return ByteData(bytes);
}